

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O2

void duckdb::ARTKey::CreateARTKey<char_const*>(ArenaAllocator *allocator,ARTKey *key,char *value)

{
  uint uVar1;
  size_t sVar2;
  undefined8 in_R8;
  string_t value_00;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 local_24;
  
  sVar2 = strlen(value);
  uVar1 = (uint)sVar2;
  if (uVar1 < 0xd) {
    local_24 = 0;
    uStack_2c = 0;
    uStack_28 = 0;
    if (uVar1 == 0) {
      value = (char *)0x0;
    }
    else {
      switchD_01939fa4::default(&uStack_2c,value,(ulong)(uVar1 & 0xf));
      value = (char *)CONCAT44(local_24,uStack_28);
    }
  }
  else {
    uStack_2c = *(undefined4 *)value;
  }
  value_00.value.pointer.ptr = (char *)in_R8;
  value_00.value._0_8_ = value;
  CreateARTKey<duckdb::string_t>
            ((ARTKey *)allocator,(ArenaAllocator *)key,(ARTKey *)CONCAT44(uStack_2c,uVar1),value_00)
  ;
  return;
}

Assistant:

void ARTKey::CreateARTKey(ArenaAllocator &allocator, ARTKey &key, const char *value) {
	ARTKey::CreateARTKey(allocator, key, string_t(value, UnsafeNumericCast<uint32_t>(strlen(value))));
}